

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_auto_choose_color
               (LodePNGColorMode *mode_out,uchar *image,uint w,uint h,LodePNGColorMode *mode_in)

{
  LodePNGColorProfile prof;
  uint error;
  LodePNGColorProfile *in_stack_fffffffffffffc00;
  LodePNGColorMode *in_stack_fffffffffffffc08;
  LodePNGColorMode *in_stack_fffffffffffffc10;
  LodePNGColorMode *in_stack_fffffffffffffcb8;
  uint in_stack_fffffffffffffcc0;
  uint in_stack_fffffffffffffcc4;
  uchar *in_stack_fffffffffffffcc8;
  LodePNGColorProfile *in_stack_fffffffffffffcd0;
  uint local_4;
  
  lodepng_color_profile_init((LodePNGColorProfile *)&stack0xfffffffffffffba8);
  local_4 = lodepng_get_color_profile
                      (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc4
                       ,in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  if (local_4 == 0) {
    local_4 = auto_choose_color_from_profile
                        (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
                         in_stack_fffffffffffffc00);
  }
  return local_4;
}

Assistant:

unsigned lodepng_auto_choose_color(LodePNGColorMode* mode_out,
                                   const unsigned char* image, unsigned w, unsigned h,
                                   const LodePNGColorMode* mode_in)
{
  unsigned error = 0;
  LodePNGColorProfile prof;
  lodepng_color_profile_init(&prof);
  error = lodepng_get_color_profile(&prof, image, w, h, mode_in);
  if(error) return error;
  return auto_choose_color_from_profile(mode_out, mode_in, &prof);
}